

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int llhttp_message_needs_eof(llhttp_t *parser)

{
  llhttp_t *parser_local;
  int local_4;
  
  if (parser->type == '\x01') {
    local_4 = 0;
  }
  else if ((((parser->status_code / 100 == 1) || (parser->status_code == 0xcc)) ||
           (parser->status_code == 0x130)) || ((parser->flags & 0x40) != 0)) {
    local_4 = 0;
  }
  else if (((parser->flags & 0x200) == 0) || ((parser->flags & 8) != 0)) {
    if ((parser->flags & 0x28) == 0) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int llhttp_message_needs_eof(const llhttp_t* parser) {
  if (parser->type == HTTP_REQUEST) {
    return 0;
  }

  /* See RFC 2616 section 4.4 */
  if (parser->status_code / 100 == 1 || /* 1xx e.g. Continue */
      parser->status_code == 204 ||     /* No Content */
      parser->status_code == 304 ||     /* Not Modified */
      (parser->flags & F_SKIPBODY)) {     /* response to a HEAD request */
    return 0;
  }

  /* RFC 7230 3.3.3, see `llhttp__after_headers_complete` */
  if ((parser->flags & F_TRANSFER_ENCODING) &&
      (parser->flags & F_CHUNKED) == 0) {
    return 1;
  }

  if (parser->flags & (F_CHUNKED | F_CONTENT_LENGTH)) {
    return 0;
  }

  return 1;
}